

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NC.hpp
# Opt level: O2

long __thiscall njoy::ENDFtk::section::Type<7,_2>::MixedElastic::NC(MixedElastic *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = CoherentElastic::NC(&this->coherent_);
  lVar2 = TabulationRecord::NC(&(this->incoherent_).super_TabulationRecord);
  return lVar2 + lVar1;
}

Assistant:

long NC() const {

  return this->coherent_.NC() + this->incoherent_.NC();
}